

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller> *this,void *pointer)

{
  PromiseArenaMember *node;
  
  if ((pointer != (void *)0x0) &&
     (node = *(PromiseArenaMember **)((long)pointer + 8), node != (PromiseArenaMember *)0x0)) {
    *(undefined8 *)((long)pointer + 8) = 0;
    PromiseDisposer::dispose(node);
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }